

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O3

void __thiscall hsql::TableRef::~TableRef(TableRef *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *__range2;
  vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *pvVar3;
  
  this->_vptr_TableRef = (_func_int **)&PTR__TableRef_0012baf8;
  free(this->schema);
  free(this->name);
  free(this->alias);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if (this->join != (JoinDefinition *)0x0) {
    (*this->join->_vptr_JoinDefinition[1])();
  }
  pvVar3 = this->list;
  if (pvVar3 == (vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *)0x0) {
    return;
  }
  ppTVar2 = (pvVar3->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (pvVar3->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar2 != ppTVar1) {
    do {
      if (*ppTVar2 != (TableRef *)0x0) {
        (*(*ppTVar2)->_vptr_TableRef[1])();
      }
      ppTVar2 = ppTVar2 + 1;
    } while (ppTVar2 != ppTVar1);
    pvVar3 = this->list;
    if (pvVar3 == (vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *)0x0) {
      pvVar3 = (vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *)0x0;
      goto LAB_0010e724;
    }
    ppTVar2 = (pvVar3->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2);
  }
LAB_0010e724:
  operator_delete(pvVar3);
  return;
}

Assistant:

TableRef::~TableRef() {
    free(schema);
    free(name);
    free(alias);

    delete select;
    delete join;

    if (list != NULL) {
      for (TableRef* table : *list) {
        delete table;
      }
      delete list;
    }
  }